

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

int MuxImageCount(WebPMuxImage *wpi_list,WebPChunkId id)

{
  WebPChunkId WVar1;
  WebPChunk **ppWVar2;
  WebPChunkId in_ESI;
  WebPMuxImage *in_RDI;
  WebPChunkId wpi_chunk_id;
  WebPChunk *wpi_chunk;
  WebPMuxImage *current;
  int count;
  WebPMuxImage *local_18;
  int local_10;
  
  local_10 = 0;
  for (local_18 = in_RDI; local_18 != (WebPMuxImage *)0x0; local_18 = local_18->next) {
    if (in_ESI == WEBP_CHUNK_NIL) {
      local_10 = local_10 + 1;
    }
    else {
      ppWVar2 = GetChunkListFromId(local_18,in_ESI);
      if ((*ppWVar2 != (WebPChunk *)0x0) &&
         (WVar1 = ChunkGetIdFromTag((*ppWVar2)->tag), WVar1 == in_ESI)) {
        local_10 = local_10 + 1;
      }
    }
  }
  return local_10;
}

Assistant:

int MuxImageCount(const WebPMuxImage* wpi_list, WebPChunkId id) {
  int count = 0;
  const WebPMuxImage* current;
  for (current = wpi_list; current != NULL; current = current->next) {
    if (id == WEBP_CHUNK_NIL) {
      ++count;  // Special case: count all images.
    } else {
      const WebPChunk* const wpi_chunk = *GetChunkListFromId(current, id);
      if (wpi_chunk != NULL) {
        const WebPChunkId wpi_chunk_id = ChunkGetIdFromTag(wpi_chunk->tag);
        if (wpi_chunk_id == id) ++count;  // Count images with a matching 'id'.
      }
    }
  }
  return count;
}